

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O3

void __thiscall HighsSearch::addBoundExceedingConflict(HighsSearch *this)

{
  double upperbound;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var1;
  HighsInt *proofinds;
  bool bVar2;
  double rhs;
  HighsCutGeneration cutGen;
  double local_150;
  HighsCutGeneration local_148;
  
  _Var1._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  upperbound = (_Var1._M_head_impl)->upper_limit;
  if (upperbound < INFINITY) {
    bVar2 = HighsLpRelaxation::computeDualProof
                      (this->lp,&(_Var1._M_head_impl)->domain,upperbound,&this->inds,&this->vals,
                       &local_150,true);
    if ((bVar2) &&
       (_Var1._M_head_impl =
             (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
       *(bool *)((long)&(_Var1._M_head_impl)->domain + 0x280) == false)) {
      proofinds = (this->inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      HighsDomain::conflictAnalysis
                (&this->localdom,proofinds,
                 (this->vals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (HighsInt)
                 ((ulong)((long)(this->inds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)proofinds) >> 2),local_150
                 ,&(_Var1._M_head_impl)->conflictPool);
      HighsCutGeneration::HighsCutGeneration
                (&local_148,this->lp,
                 &((this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool);
      HighsCutGeneration::generateConflict
                (&local_148,&this->localdom,&this->inds,&this->vals,&local_150);
      if (local_148.deltas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.deltas.super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if (local_148.integerinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.integerinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_148.isintegral.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.isintegral.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_148.complementation.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.complementation.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_148.solval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.solval.super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if (local_148.upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_148.cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void HighsSearch::addBoundExceedingConflict() {
  if (mipsolver.mipdata_->upper_limit != kHighsInf) {
    double rhs;
    if (lp->computeDualProof(mipsolver.mipdata_->domain,
                             mipsolver.mipdata_->upper_limit, inds, vals,
                             rhs)) {
      if (mipsolver.mipdata_->domain.infeasible()) return;
      localdom.conflictAnalysis(inds.data(), vals.data(), inds.size(), rhs,
                                mipsolver.mipdata_->conflictPool);

      HighsCutGeneration cutGen(*lp, mipsolver.mipdata_->cutpool);
      mipsolver.mipdata_->debugSolution.checkCut(inds.data(), vals.data(),
                                                 inds.size(), rhs);
      cutGen.generateConflict(localdom, inds, vals, rhs);
    }
  }
}